

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DExporter::AttrHelper_Col4DArrToString
          (X3DExporter *this,aiColor4D *pArray,size_t pArray_Size,string *pTargetString)

{
  size_type sVar1;
  pointer pcVar2;
  string *psVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  long *plVar7;
  size_type sVar8;
  string *__range2;
  ulong uVar9;
  undefined8 uVar10;
  float *pfVar11;
  long *local_198;
  undefined8 local_190;
  long local_188;
  undefined8 uStack_180;
  long *local_178;
  undefined8 local_170;
  long local_168;
  undefined8 uStack_160;
  long *local_158;
  undefined8 local_150;
  long local_148;
  undefined8 uStack_140;
  ulong *local_138;
  long local_130;
  ulong local_128;
  long lStack_120;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  string *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTargetString->_M_string_length = 0;
  *(pTargetString->_M_dataplus)._M_p = '\0';
  local_b8 = pTargetString;
  std::__cxx11::string::reserve((ulong)pTargetString);
  if (pArray_Size != 0) {
    pfVar11 = &pArray->a;
    do {
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_50,vsnprintf,0x3a,"%f",SUB84((double)((aiColor4D *)(pfVar11 + -3))->r,0));
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_138 = &local_128;
      puVar6 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar6) {
        local_128 = *puVar6;
        lStack_120 = plVar4[3];
      }
      else {
        local_128 = *puVar6;
        local_138 = (ulong *)*plVar4;
      }
      local_130 = plVar4[1];
      *plVar4 = (long)puVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_70,vsnprintf,0x3a,"%f",SUB84((double)pfVar11[-2],0));
      uVar9 = 0xf;
      if (local_138 != &local_128) {
        uVar9 = local_128;
      }
      if (uVar9 < local_70._M_string_length + local_130) {
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          uVar10 = local_70.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_70._M_string_length + local_130) goto LAB_00355424;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_138);
      }
      else {
LAB_00355424:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_138,(ulong)local_70._M_dataplus._M_p);
      }
      local_198 = &local_188;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_188 = *plVar4;
        uStack_180 = puVar5[3];
      }
      else {
        local_188 = *plVar4;
        local_198 = (long *)*puVar5;
      }
      local_190 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_198);
      local_118 = &local_108;
      puVar6 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar6) {
        local_108 = *puVar6;
        lStack_100 = plVar4[3];
      }
      else {
        local_108 = *puVar6;
        local_118 = (ulong *)*plVar4;
      }
      local_110 = plVar4[1];
      *plVar4 = (long)puVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_90,vsnprintf,0x3a,"%f",SUB84((double)pfVar11[-1],0));
      uVar9 = 0xf;
      if (local_118 != &local_108) {
        uVar9 = local_108;
      }
      if (uVar9 < local_90._M_string_length + local_110) {
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          uVar10 = local_90.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_90._M_string_length + local_110) goto LAB_00355570;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_118);
      }
      else {
LAB_00355570:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_118,(ulong)local_90._M_dataplus._M_p);
      }
      local_178 = &local_168;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_168 = *plVar4;
        uStack_160 = puVar5[3];
      }
      else {
        local_168 = *plVar4;
        local_178 = (long *)*puVar5;
      }
      local_170 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_178);
      puVar6 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar6) {
        local_e8 = *puVar6;
        lStack_e0 = plVar4[3];
        local_f8 = &local_e8;
      }
      else {
        local_e8 = *puVar6;
        local_f8 = (ulong *)*plVar4;
      }
      local_f0 = plVar4[1];
      *plVar4 = (long)puVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_b0,vsnprintf,0x3a,"%f",SUB84((double)*pfVar11,0));
      uVar9 = 0xf;
      if (local_f8 != &local_e8) {
        uVar9 = local_e8;
      }
      if (uVar9 < local_b0._M_string_length + local_f0) {
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          uVar10 = local_b0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_b0._M_string_length + local_f0) goto LAB_003556b2;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_f8);
      }
      else {
LAB_003556b2:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_b0._M_dataplus._M_p)
        ;
      }
      local_158 = &local_148;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_148 = *plVar4;
        uStack_140 = puVar5[3];
      }
      else {
        local_148 = *plVar4;
        local_158 = (long *)*puVar5;
      }
      local_150 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_158);
      local_d8 = &local_c8;
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_c8 = *plVar7;
        lStack_c0 = plVar4[3];
      }
      else {
        local_c8 = *plVar7;
        local_d8 = (long *)*plVar4;
      }
      local_d0 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_b8,(ulong)local_d8);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_158 != &local_148) {
        operator_delete(local_158,local_148 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_178 != &local_168) {
        operator_delete(local_178,local_168 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      if (local_198 != &local_188) {
        operator_delete(local_198,local_188 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138,local_128 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pfVar11 = pfVar11 + 4;
      pArray_Size = pArray_Size - 1;
    } while (pArray_Size != 0);
  }
  psVar3 = local_b8;
  std::__cxx11::string::resize((ulong)local_b8,(char)local_b8->_M_string_length + -1);
  sVar1 = psVar3->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (psVar3->_M_dataplus)._M_p;
    sVar8 = 0;
    do {
      if (pcVar2[sVar8] == ',') {
        pcVar2[sVar8] = '.';
      }
      sVar8 = sVar8 + 1;
    } while (sVar1 != sVar8);
  }
  return;
}

Assistant:

void X3DExporter::AttrHelper_Col4DArrToString(const aiColor4D* pArray, const size_t pArray_Size, string& pTargetString)
{
	pTargetString.clear();
	pTargetString.reserve(pArray_Size * 8);// (Number + space) * 4.
	for(size_t idx = 0; idx < pArray_Size; idx++)
		pTargetString.append(to_string(pArray[idx].r) + " " + to_string(pArray[idx].g) + " " + to_string(pArray[idx].b) + " " +
								to_string(pArray[idx].a) + " ");

	// remove last space symbol.
	pTargetString.resize(pTargetString.length() - 1);
	AttrHelper_CommaToPoint(pTargetString);
}